

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O2

VkBool32 vk::anon_unknown_0::debugReportCallback
                   (VkDebugReportFlagsEXT flags,VkDebugReportObjectTypeEXT objectType,
                   deUint64 object,size_t location,deInt32 messageCode,char *pLayerPrefix,
                   char *pMessage,void *pUserData)

{
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  DebugReportMessage local_90;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pLayerPrefix,&local_d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pMessage,&local_d2);
  DebugReportMessage::DebugReportMessage
            (&local_90,flags,objectType,object,location,messageCode,&local_d0,&local_b0);
  de::AppendList<vk::DebugReportMessage>::append
            ((AppendList<vk::DebugReportMessage> *)pUserData,&local_90);
  DebugReportMessage::~DebugReportMessage(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return 0;
}

Assistant:

VKAPI_ATTR VkBool32	VKAPI_CALL debugReportCallback (VkDebugReportFlagsEXT		flags,
													VkDebugReportObjectTypeEXT	objectType,
													deUint64					object,
													size_t						location,
													deInt32						messageCode,
													const char*					pLayerPrefix,
													const char*					pMessage,
													void*						pUserData)
{
	DebugReportRecorder::MessageList* const	messageList	= reinterpret_cast<DebugReportRecorder::MessageList*>(pUserData);

	messageList->append(DebugReportMessage(flags, objectType, object, location, messageCode, pLayerPrefix, pMessage));

	// Return false to indicate that the call should not return error and should
	// continue execution normally.
	return VK_FALSE;
}